

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_int,_sptk::int24_t>::Run
          (DataTransform<unsigned_int,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  NumericType NVar4;
  WarningType WVar5;
  bool bVar6;
  char *__nptr;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  undefined8 uVar11;
  ostream *poVar12;
  size_t sVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int24_t *piVar20;
  uint uVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint input_data;
  string word;
  char buffer [128];
  int24_t local_28c;
  int24_t local_289;
  ushort local_286;
  uint local_284;
  int24_t *local_280;
  int24_t *local_278;
  istream *local_270;
  ulong local_268;
  string local_260;
  string *local_240;
  long local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_278 = &this->minimum_value_;
  local_280 = &this->maximum_value_;
  local_240 = &this->print_format_;
  uVar26 = 0;
  local_270 = input_stream;
  do {
    iVar8 = (int)uVar26;
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(local_270,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar6 = true;
        bVar7 = false;
      }
      else {
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        *piVar10 = 0;
        strtold(__nptr,(char **)&local_260);
        if (local_260._M_dataplus._M_p == __nptr) {
          uVar11 = std::__throw_invalid_argument("stold");
LAB_001351d3:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar11);
        }
        if (*piVar10 == 0) {
          *piVar10 = iVar3;
        }
        else if (*piVar10 == 0x22) {
          uVar11 = std::__throw_out_of_range("stold");
          goto LAB_001351d3;
        }
        local_286 = in_FPUControlWord | 0xc00;
        local_238 = (long)ROUND(in_ST0);
        local_284 = (uint)local_238;
        bVar6 = false;
        bVar7 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar7) goto LAB_00134e15;
      if (bVar6) {
        if (bVar6) {
LAB_00135178:
          bVar7 = true;
          if ((this->is_ascii_output_ == true) && (iVar8 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_001351bd:
          bVar7 = false;
        }
        return bVar7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<unsigned_int>(&local_284,local_270);
      if (!bVar7) goto LAB_00135178;
LAB_00134e15:
      bVar15 = (this->minimum_value_).value[2];
      uVar18 = (uint)bVar15 * 0x10000;
      bVar23 = (this->minimum_value_).value[1];
      uVar21 = (uint)bVar23 * 0x100;
      uVar22 = (uint)(this->minimum_value_).value[0];
      uVar9 = uVar18 + uVar22 | uVar21;
      uVar19 = uVar9 | 0xff000000;
      if (-1 < (char)bVar15) {
        uVar19 = uVar9;
      }
      bVar1 = (this->maximum_value_).value[2];
      uVar14 = (uint)bVar1 * 0x10000;
      bVar2 = (this->maximum_value_).value[1];
      uVar16 = (uint)bVar2 * 0x100;
      uVar17 = (uint)(this->maximum_value_).value[0];
      uVar24 = uVar14 + uVar17 | uVar16;
      uVar9 = uVar24 | 0xff000000;
      if (-1 < (char)bVar1) {
        uVar9 = uVar24;
      }
      uVar25 = (ulong)local_284;
      local_268 = uVar26;
      if ((int)uVar19 < (int)uVar9) {
        NVar4 = this->input_numeric_type_;
        piVar20 = local_278;
        if (NVar4 == kFloatingPoint) {
LAB_00134ea5:
          uVar19 = (uVar21 - 0x1000000) + (uVar18 | uVar22);
          if (-1 < (char)bVar15) {
            uVar19 = uVar18 | uVar22 | uVar21;
          }
          if ((long)(int)uVar19 <= (long)uVar25) {
            uVar19 = (uVar16 - 0x1000000) + (uVar14 | uVar17);
            if (-1 < (char)bVar1) {
              uVar19 = uVar14 | uVar17 | uVar16;
            }
            piVar20 = local_280;
            bVar15 = bVar1;
            bVar23 = bVar2;
            if ((long)uVar25 <= (long)(int)uVar19) goto LAB_00135002;
          }
        }
        else {
          if (NVar4 != kUnsignedInteger) {
            if (NVar4 != kSignedInteger) goto LAB_00135002;
            goto LAB_00134ea5;
          }
          uVar19 = (uVar21 - 0x1000000) + (uVar18 | uVar22);
          if (-1 < (char)bVar15) {
            uVar19 = uVar18 | uVar22 | uVar21;
          }
          if ((ulong)(long)(int)uVar19 <= uVar25) {
            uVar19 = (uVar16 - 0x1000000) + (uVar14 | uVar17);
            if (-1 < (char)bVar1) {
              uVar19 = uVar14 | uVar17 | uVar16;
            }
            piVar20 = local_280;
            bVar15 = bVar1;
            bVar23 = bVar2;
            if (uVar25 <= (ulong)(long)(int)uVar19) goto LAB_00135002;
          }
        }
        uVar25 = (ulong)piVar20->value[0];
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"th data is over the range of output type",0x28);
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"x2x","");
          sptk::PrintErrorMessage(&local_260,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          WVar5 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar5 == kExit) goto LAB_001351bd;
        }
      }
      else {
LAB_00135002:
        if (this->rounding_ == true) {
          if (uVar25 == 0) {
            bVar15 = 0;
            bVar23 = 0;
            uVar25 = 0;
            goto LAB_00135036;
          }
          uVar25 = (ulong)(uint)(int)((double)uVar25 + 0.5);
        }
        bVar23 = (byte)(uVar25 >> 8);
        bVar15 = (byte)(uVar25 >> 0x10);
      }
LAB_00135036:
      if (this->is_ascii_output_ == true) {
        local_289.value[0] = (uint8_t)uVar25;
        local_289.value[1] = bVar23;
        local_289.value[2] = bVar15;
        bVar7 = sptk::SnPrintf<sptk::int24_t>(&local_289,local_240,0x80,local_b8);
        if (!bVar7) goto LAB_001351bd;
        sVar13 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar13);
        if ((iVar8 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        local_28c.value[0] = (uint8_t)uVar25;
        local_28c.value[1] = bVar23;
        local_28c.value[2] = bVar15;
        bVar7 = sptk::WriteStream<sptk::int24_t>(&local_28c,(ostream *)&std::cout);
        if (!bVar7) goto LAB_001351bd;
      }
    }
    uVar26 = (ulong)(iVar8 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }